

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_array.h
# Opt level: O0

iterator __thiscall
gtl::compact_array_base<int,_std::allocator<int>_>::make_hole
          (compact_array_base<int,_std::allocator<int>_> *this,const_iterator p,size_type_conflict n
          )

{
  size_type_conflict sVar1;
  uint n_00;
  int *piVar2;
  int *piVar3;
  size_type_conflict index;
  size_type_conflict new_size;
  iterator q;
  size_type_conflict n_local;
  const_iterator p_local;
  compact_array_base<int,_std::allocator<int>_> *this_local;
  
  _index = p;
  if (n != 0) {
    sVar1 = size(this);
    n_00 = sVar1 + n;
    piVar2 = Array(this);
    reallocate(this,n_00);
    piVar3 = Array(this);
    _index = piVar3 + ((long)p - (long)piVar2 >> 2 & 0xffffffff);
    piVar2 = Array(this);
    move(this,_index,piVar2 + ((ulong)n_00 - (ulong)n),_index + n);
    set_size(this,n_00);
  }
  return _index;
}

Assistant:

iterator make_hole(const_iterator p, size_type n) {
    iterator q = const_cast<iterator>(p);
    if (n != 0) {
      size_type new_size = size() + n;
      size_type index = q - Array();
      reallocate(new_size);
      q = Array() + index;
      move(q, Array() + new_size - n, q + n);
      set_size(new_size);
    }
    return q;
  }